

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:213:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:213:17)>
            *this)

{
  Server *pSVar1;
  Own<capnp::ClientHook> OVar2;
  Own<capnp::Capability::Server> local_30;
  Disposer *local_20;
  Server *local_18;
  
  heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
            ((kj *)&local_20,(char (*) [8])0x4d17d4);
  local_30.disposer = local_20;
  local_30.ptr = local_18;
  if (local_18 != (Server *)0x0) {
    local_30.ptr = (Server *)&local_18[1].thisHook;
  }
  local_18 = (Server *)0x0;
  OVar2 = capnp::Capability::Client::makeLocalClient
                    ((Client *)&__return_storage_ptr__->field_0x8,&local_30);
  pSVar1 = local_30.ptr;
  if (local_30.ptr != (Server *)0x0) {
    local_30.ptr = (Server *)0x0;
    (**(local_30.disposer)->_vptr_Disposer)
              (local_30.disposer,
               (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]),OVar2.ptr
              );
  }
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }